

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.hpp
# Opt level: O0

void __thiscall pugi::xml_writer_file::~xml_writer_file(xml_writer_file *this)

{
  void *in_RDI;
  
  ~xml_writer_file((xml_writer_file *)0x148808);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

class PUGIXML_CLASS xml_writer_file: public xml_writer
	{
	public:
		// Construct writer from a FILE* object; void* is used to avoid header dependencies on stdio
		xml_writer_file(void* file);

		virtual void write(const void* data, size_t size) PUGIXML_OVERRIDE;

	private:
		void* file;
	}